

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O2

void __thiscall
vmips::CFGNode::branch_existing<vmips::beqz,std::shared_ptr<vmips::VirtReg>&>
          (CFGNode *this,shared_ptr<vmips::CFGNode> *node,shared_ptr<vmips::VirtReg> *args)

{
  shared_ptr<vmips::beqz> instr;
  __shared_ptr<vmips::beqz,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  __shared_ptr<vmips::Instruction,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__weak_ptr<vmips::CFGNode,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<vmips::CFGNode,void>
            ((__weak_ptr<vmips::CFGNode,(__gnu_cxx::_Lock_policy)2> *)&_Stack_48,
             &node->super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>);
  std::vector<std::weak_ptr<vmips::CFGNode>,std::allocator<std::weak_ptr<vmips::CFGNode>>>::
  emplace_back<std::weak_ptr<vmips::CFGNode>>
            ((vector<std::weak_ptr<vmips::CFGNode>,std::allocator<std::weak_ptr<vmips::CFGNode>>> *)
             (this + 0x48),(weak_ptr<vmips::CFGNode> *)&_Stack_48);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_48._M_refcount);
  std::
  make_shared<vmips::beqz,std::shared_ptr<vmips::CFGNode>const&,std::shared_ptr<vmips::VirtReg>&>
            ((shared_ptr<vmips::CFGNode> *)&_Stack_48,(shared_ptr<vmips::VirtReg> *)node);
  std::__shared_ptr<vmips::Instruction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<vmips::beqz,void>
            (local_38,&_Stack_48);
  std::
  vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>::
  emplace_back<std::shared_ptr<vmips::Instruction>>
            ((vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>
              *)(this + 0x30),(shared_ptr<vmips::Instruction> *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  return;
}

Assistant:

void branch_existing(const std::shared_ptr<CFGNode> &node, Args &&... args) {
            out_edges.push_back(node);
            auto instr = std::make_shared<Instr>(node, std::forward<Args>(args)...);
            instructions.push_back(instr);
        }